

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::select_variables(solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                   *this,int r_size,int bkmin,int bkmax)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int unaff_R12D;
  double dVar7;
  
  iVar6 = bkmin;
  if (r_size < bkmin) {
    iVar6 = r_size;
  }
  if (bkmin == bkmax) {
    iVar6 = iVar6 + -1;
  }
  else {
    iVar4 = bkmax;
    if (r_size < bkmax) {
      iVar4 = r_size;
    }
    bVar2 = bkmax < iVar6;
    if (iVar6 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      unaff_R12D = r_size + -1;
      lVar5 = (long)r_size;
      do {
        fVar1 = (this->R)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
                ._M_head_impl[lVar5].value;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          bVar3 = fVar1 < 0.0;
        }
        else {
          dVar7 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar3 = dVar7 < 0.5;
        }
        if (bVar3) break;
        bVar2 = iVar4 <= lVar5;
        unaff_R12D = unaff_R12D + 1;
        lVar5 = lVar5 + 1;
      } while (iVar6 != unaff_R12D);
    }
    iVar6 = iVar4 + -1;
    if (!bVar2) {
      iVar6 = unaff_R12D;
    }
  }
  return iVar6;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }